

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

CURLcode Curl_creader_set_buf(Curl_easy *data,char *buf,size_t blen)

{
  void *pvVar1;
  Curl_creader *pCVar2;
  curl_trc_feat *pcVar3;
  CURLcode CVar4;
  Curl_creader *in_RAX;
  Curl_creader *r;
  Curl_creader *local_38;
  
  local_38 = in_RAX;
  CVar4 = Curl_creader_create(&local_38,data,&cr_buf,CURL_CR_CLIENT);
  if (CVar4 == CURLE_OK) {
    pvVar1 = local_38->ctx;
    *(char **)((long)pvVar1 + 0x20) = buf;
    *(size_t *)((long)pvVar1 + 0x28) = blen;
    *(undefined8 *)((long)pvVar1 + 0x30) = 0;
    pCVar2 = (data->req).reader_stack;
    while (pCVar2 != (Curl_creader *)0x0) {
      (data->req).reader_stack = pCVar2->next;
      (*pCVar2->crt->do_close)(data,pCVar2);
      (*Curl_cfree)(pCVar2);
      pCVar2 = (data->req).reader_stack;
    }
    CVar4 = do_init_reader_stack(data,local_38);
  }
  else if (data == (Curl_easy *)0x0) {
    return CVar4;
  }
  if ((((data->set).field_0x8cd & 0x10) != 0) &&
     (((pcVar3 = (data->state).feat, pcVar3 == (curl_trc_feat *)0x0 || (0 < pcVar3->log_level)) &&
      (0 < Curl_trc_feat_read.log_level)))) {
    Curl_trc_read(data,"add buf reader, len=%zu -> %d",blen,(ulong)CVar4);
  }
  return CVar4;
}

Assistant:

CURLcode Curl_creader_set_buf(struct Curl_easy *data,
                               const char *buf, size_t blen)
{
  CURLcode result;
  struct Curl_creader *r;
  struct cr_buf_ctx *ctx;

  result = Curl_creader_create(&r, data, &cr_buf, CURL_CR_CLIENT);
  if(result)
    goto out;
  ctx = r->ctx;
  ctx->buf = buf;
  ctx->blen = blen;
  ctx->index = 0;

  cl_reset_reader(data);
  result = do_init_reader_stack(data, r);
out:
  CURL_TRC_READ(data, "add buf reader, len=%zu -> %d", blen, result);
  return result;
}